

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O0

void av1_rd_stats_subtraction(int mult,RD_STATS *left,RD_STATS *right,RD_STATS *result)

{
  int64_t iVar1;
  RD_STATS *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int in_EDI;
  
  if ((((*in_RSI == 0x7fffffff) || (*in_RDX == 0x7fffffff)) ||
      (*(long *)(in_RSI + 2) == 0x7fffffffffffffff)) ||
     (((*(long *)(in_RDX + 2) == 0x7fffffffffffffff || (*(long *)(in_RSI + 4) == 0x7fffffffffffffff)
       ) || (*(long *)(in_RDX + 4) == 0x7fffffffffffffff)))) {
    av1_invalid_rd_stats(in_RCX);
  }
  else {
    in_RCX->rate = *in_RSI - *in_RDX;
    in_RCX->dist = *(long *)(in_RSI + 2) - *(long *)(in_RDX + 2);
    iVar1 = av1_calculate_rd_cost(in_EDI,in_RCX->rate,in_RCX->dist);
    in_RCX->rdcost = iVar1;
  }
  return;
}

Assistant:

static inline void av1_rd_stats_subtraction(int mult,
                                            const RD_STATS *const left,
                                            const RD_STATS *const right,
                                            RD_STATS *result) {
  if (left->rate == INT_MAX || right->rate == INT_MAX ||
      left->dist == INT64_MAX || right->dist == INT64_MAX ||
      left->rdcost == INT64_MAX || right->rdcost == INT64_MAX) {
    av1_invalid_rd_stats(result);
  } else {
    result->rate = left->rate - right->rate;
    result->dist = left->dist - right->dist;
    result->rdcost = av1_calculate_rd_cost(mult, result->rate, result->dist);
  }
}